

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_copy_to_ucol.h
# Opt level: O2

int __thiscall
Eigen::internal::SparseLUImpl<double,_int>::copy_to_ucol
          (SparseLUImpl<double,_int> *this,int jcol,int nseg,IndexVector *segrep,
          BlockIndexVector *repfnz,IndexVector *perm_r,BlockScalarVector *dense,GlobalLU_t *glu)

{
  Index *length;
  Scalar SVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Scalar SVar7;
  int iVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  Scalar *pSVar12;
  int iVar13;
  int iVar14;
  long index;
  long lVar15;
  int nbElts;
  long index_00;
  
  pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,
                      (long)jcol);
  iVar2 = *pSVar9;
  pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xusub,
                      (long)jcol);
  nbElts = *pSVar9;
  length = &glu->nzumax;
  index = (long)nseg;
  iVar13 = 0;
  iVar14 = 0;
  if (0 < nseg) {
    iVar14 = nseg;
  }
  do {
    if (iVar13 == iVar14) {
      pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xusub,
                          (long)(jcol + 1));
      *pSVar9 = nbElts;
      return 0;
    }
    index = index + -1;
    pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)segrep,index);
    iVar3 = *pSVar9;
    pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,
                        (long)iVar3);
    iVar4 = *pSVar9;
    if (iVar2 != iVar4) {
      pSVar10 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)repfnz,(long)iVar3);
      iVar5 = *pSVar10;
      if (iVar5 != -1) {
        pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,
                            (long)iVar4);
        iVar4 = *pSVar9;
        pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                            (long)iVar4);
        iVar6 = *pSVar9;
        while (*length < (iVar3 - iVar5) + nbElts + 1) {
          iVar8 = SparseLUImpl<double,int>::expand<Eigen::Matrix<double,_1,1,0,_1,1>>
                            ((SparseLUImpl<double,int> *)this,&glu->ucol,length,nbElts,0,
                             &glu->num_expansions);
          if (iVar8 != 0) {
            return iVar8;
          }
          iVar8 = SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
                            ((SparseLUImpl<double,int> *)this,&glu->usub,length,nbElts,1,
                             &glu->num_expansions);
          if (iVar8 != 0) {
            return iVar8;
          }
        }
        for (lVar15 = 0; (int)lVar15 <= iVar3 - iVar5; lVar15 = lVar15 + 1) {
          pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->lsub,
                              ((iVar5 - iVar4) + iVar6) + lVar15);
          index_00 = (long)*pSVar9;
          pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)perm_r,
                              index_00);
          SVar7 = *pSVar9;
          pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->usub,
                              nbElts + lVar15);
          *pSVar9 = SVar7;
          pSVar11 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                                  *)dense,index_00);
          SVar1 = *pSVar11;
          pSVar12 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               &glu->ucol,nbElts + lVar15);
          *pSVar12 = SVar1;
          pSVar11 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                                  *)dense,index_00);
          *pSVar11 = 0.0;
        }
        nbElts = nbElts + (int)lVar15;
      }
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

Index SparseLUImpl<Scalar,Index>::copy_to_ucol(const Index jcol, const Index nseg, IndexVector& segrep, BlockIndexVector repfnz ,IndexVector& perm_r, BlockScalarVector dense, GlobalLU_t& glu)
{  
  Index ksub, krep, ksupno; 
    
  Index jsupno = glu.supno(jcol);
  
  // For each nonzero supernode segment of U[*,j] in topological order 
  Index k = nseg - 1, i; 
  Index nextu = glu.xusub(jcol); 
  Index kfnz, isub, segsize; 
  Index new_next,irow; 
  Index fsupc, mem; 
  for (ksub = 0; ksub < nseg; ksub++)
  {
    krep = segrep(k); k--; 
    ksupno = glu.supno(krep); 
    if (jsupno != ksupno ) // should go into ucol(); 
    {
      kfnz = repfnz(krep); 
      if (kfnz != emptyIdxLU)
      { // Nonzero U-segment 
        fsupc = glu.xsup(ksupno); 
        isub = glu.xlsub(fsupc) + kfnz - fsupc; 
        segsize = krep - kfnz + 1; 
        new_next = nextu + segsize; 
        while (new_next > glu.nzumax) 
        {
          mem = memXpand<ScalarVector>(glu.ucol, glu.nzumax, nextu, UCOL, glu.num_expansions); 
          if (mem) return mem; 
          mem = memXpand<IndexVector>(glu.usub, glu.nzumax, nextu, USUB, glu.num_expansions); 
          if (mem) return mem; 
          
        }
        
        for (i = 0; i < segsize; i++)
        {
          irow = glu.lsub(isub); 
          glu.usub(nextu) = perm_r(irow); // Unlike the L part, the U part is stored in its final order
          glu.ucol(nextu) = dense(irow); 
          dense(irow) = Scalar(0.0); 
          nextu++;
          isub++;
        }
        
      } // end nonzero U-segment 
      
    } // end if jsupno 
    
  } // end for each segment
  glu.xusub(jcol + 1) = nextu; // close U(*,jcol)
  return 0; 
}